

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemeditorfactory.cpp
# Opt level: O0

void __thiscall QExpandingLineEdit::updateMinimumWidth(QExpandingLineEdit *this)

{
  int iVar1;
  QStyle *pQVar2;
  long *in_RDI;
  long in_FS_OFFSET;
  int minWidth;
  int width;
  QMargins cm;
  QMargins tm;
  QStyleOptionFrame opt;
  QWidget *this_00;
  undefined4 in_stack_ffffffffffffff30;
  QLineEdit *in_stack_ffffffffffffff38;
  QWidget *in_stack_ffffffffffffff48;
  QWidget *this_01;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 *local_58;
  undefined1 *puStack_50;
  QWidgetData *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = (undefined1  [16])QLineEdit::textMargins(in_stack_ffffffffffffff38);
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = (undefined1  [16])QWidget::contentsMargins(in_stack_ffffffffffffff48);
  this_00 = (QWidget *)local_68;
  iVar1 = QMargins::left((QMargins *)0x858024);
  QMargins::right((QMargins *)0x858031);
  QMargins::left((QMargins *)0x85804c);
  QMargins::right((QMargins *)0x858062);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)0x8580b5);
  (**(code **)(*in_RDI + 0x1a0))(in_RDI,&local_58);
  pQVar2 = QWidget::style(this_00);
  this_01 = (QWidget *)local_88;
  QSize::QSize((QSize *)CONCAT44(iVar1,in_stack_ffffffffffffff30),(int)((ulong)this_00 >> 0x20),
               (int)this_00);
  local_88._8_8_ = (**(code **)(*(long *)pQVar2 + 0xe8))(pQVar2,0xe,&local_58,this_01,in_RDI);
  iVar1 = (int)((ulong)pQVar2 >> 0x20);
  QSize::width((QSize *)0x858123);
  QWidget::setMinimumWidth(this_01,iVar1);
  QStyleOptionFrame::~QStyleOptionFrame((QStyleOptionFrame *)0x85813f);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QExpandingLineEdit::updateMinimumWidth()
{
    const QMargins tm = textMargins();
    const QMargins cm = contentsMargins();
    const int width = tm.left() + tm.right() + cm.left() + cm.right() + 4 /*horizontalMargin in qlineedit.cpp*/;

    QStyleOptionFrame opt;
    initStyleOption(&opt);

    int minWidth = style()->sizeFromContents(QStyle::CT_LineEdit, &opt, QSize(width, 0), this).width();
    setMinimumWidth(minWidth);
}